

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extend.c
# Opt level: O3

int remap(KEYMAP *curmap,int c,PF funct,KEYMAP *pref_map)

{
  long lVar1;
  short sVar2;
  short sVar3;
  PF *pp_Var4;
  bool bVar5;
  KCHAR KVar6;
  PF *pp_Var7;
  keymap_s *pkVar8;
  PF p_Var9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  map_element *pmVar15;
  map_element *pmVar16;
  long lVar17;
  short sVar18;
  int iVar19;
  uint local_40;
  
  pmVar15 = ele;
  sVar2 = curmap->map_num;
  pmVar16 = curmap->map_element + sVar2;
  sVar18 = (short)c;
  if ((pmVar16 <= ele) || (iVar11 = c - ele->k_base, c < ele->k_base)) {
    iVar19 = 1000;
    iVar11 = 1000;
    if (curmap->map_element < ele) {
      if ((funct != (PF)0x0) || (ele[-1].k_prefmap == (keymap_s *)0x0)) {
        iVar11 = c - ele[-1].k_num;
        goto LAB_0010ed84;
      }
      if (ele < pmVar16) goto LAB_0010edc4;
LAB_0010ef05:
      if ((curmap->map_max <= sVar2) && (curmap = reallocmap(curmap), curmap == (KEYMAP *)0x0)) {
        return 0;
      }
      pp_Var7 = (PF *)malloc(8);
      if (pp_Var7 == (PF *)0x0) goto LAB_0010f225;
      *pp_Var7 = funct;
      pmVar16 = ele;
      sVar2 = curmap->map_num;
      for (pmVar15 = curmap->map_element + sVar2; pmVar16 < pmVar15; pmVar15 = pmVar15 + -1) {
        KVar6 = pmVar15[-1].k_num;
        pmVar15->k_base = pmVar15[-1].k_base;
        pmVar15->k_num = KVar6;
        pkVar8 = pmVar15[-1].k_prefmap;
        pmVar15->k_funcp = pmVar15[-1].k_funcp;
        pmVar15->k_prefmap = pkVar8;
      }
      pmVar16->k_base = sVar18;
      pmVar16->k_num = sVar18;
      pmVar16->k_funcp = pp_Var7;
      pmVar16->k_prefmap = (keymap_s *)0x0;
      curmap->map_num = sVar2 + 1;
    }
    else {
LAB_0010ed84:
      if (ele < pmVar16) {
        if (funct == (PF)0x0) {
LAB_0010edc4:
          if (ele->k_prefmap != (keymap_s *)0x0) goto LAB_0010edd2;
        }
        iVar19 = ele->k_base - c;
      }
LAB_0010edd2:
      if ((iVar11 < 5) && (iVar11 <= iVar19)) {
        sVar2 = ele[-1].k_base;
        ele = ele + -1;
        pp_Var7 = (PF *)calloc((long)((c - sVar2) + 1),8);
        if (pp_Var7 == (PF *)0x0) goto LAB_0010f225;
        uVar14 = 0;
        if (sVar2 <= pmVar15[-1].k_num) {
          uVar14 = (ulong)(((int)pmVar15[-1].k_num - (int)sVar2) + 1);
          pp_Var4 = pmVar15[-1].k_funcp;
          uVar12 = 0;
          do {
            pp_Var7[uVar12] = pp_Var4[uVar12];
            uVar12 = uVar12 + 1;
          } while (uVar14 != uVar12);
        }
        uVar10 = (uint)uVar14;
        if (iVar11 != 1) {
          p_Var9 = curmap->map_default;
          lVar13 = 0;
          do {
            pp_Var7[uVar14 + lVar13] = p_Var9;
            lVar13 = lVar13 + 1;
          } while (iVar11 + -1 != (int)lVar13);
          uVar10 = uVar10 + (int)lVar13;
        }
        pp_Var7[uVar10] = funct;
        pmVar15[-1].k_num = sVar18;
        pmVar15[-1].k_funcp = pp_Var7;
      }
      else {
        if (4 < iVar19) goto LAB_0010ef05;
        sVar2 = ele->k_num;
        pp_Var7 = (PF *)calloc((long)((sVar2 - c) + 1),8);
        if (pp_Var7 == (PF *)0x0) goto LAB_0010f225;
        sVar3 = pmVar15->k_base;
        if (sVar3 <= sVar2) {
          pp_Var4 = pmVar15->k_funcp;
          uVar14 = 0;
          do {
            pp_Var7[(long)iVar19 + uVar14] = pp_Var4[uVar14];
            uVar14 = uVar14 + 1;
          } while (((int)sVar2 - (int)sVar3) + 1 != uVar14);
        }
        if (iVar19 + -1 != 0) {
          p_Var9 = curmap->map_default;
          lVar13 = (long)(iVar19 + -1);
          do {
            pp_Var7[lVar13] = p_Var9;
            lVar13 = lVar13 + -1;
          } while (lVar13 != 0);
        }
        *pp_Var7 = funct;
        pmVar15->k_base = sVar18;
        pmVar15->k_funcp = pp_Var7;
      }
    }
    if (funct != (PF)0x0) {
      return 1;
    }
    if (pref_map != (KEYMAP *)0x0) goto LAB_0010f08e;
    pkVar8 = (keymap_s *)malloc(0x70);
    if (pkVar8 != (keymap_s *)0x0) {
      pkVar8->map_num = 0;
      pkVar8->map_max = 4;
      pkVar8->map_default = rescan;
      goto LAB_0010f0c1;
    }
    dobeep_msg("Out of memory");
    p_Var9 = curmap->map_default;
    pp_Var7 = ele->k_funcp;
    lVar13 = (long)ele->k_base;
    goto LAB_0010f2ad;
  }
  pp_Var7 = ele->k_funcp;
  lVar13 = (long)iVar11;
  if (pp_Var7[lVar13] == funct) {
    if (pref_map == (KEYMAP *)0x0 || funct != (PF)0x0) {
      return 1;
    }
    pkVar8 = ele->k_prefmap;
    if (pkVar8 == pref_map) {
      return 1;
    }
LAB_0010f01f:
    if (pkVar8 != (keymap_s *)0x0) {
      if (iVar11 < 1) {
        local_40 = 1;
        uVar14 = 0;
      }
      else {
        lVar17 = 1;
        do {
          p_Var9 = pp_Var7[lVar17 + -1];
          if (p_Var9 == (PF)0x0) break;
          bVar5 = lVar17 < lVar13;
          lVar17 = lVar17 + 1;
        } while (bVar5);
        uVar14 = (ulong)(p_Var9 == (PF)0x0);
        local_40 = (uint)(p_Var9 != (PF)0x0);
      }
      if ((curmap->map_max <= sVar2) && (curmap = reallocmap(curmap), curmap == (KEYMAP *)0x0)) {
        return 0;
      }
      pmVar15 = ele;
      pp_Var7 = (PF *)calloc((long)(((int)uVar14 - c) + (int)ele->k_num),8);
      if (pp_Var7 == (PF *)0x0) {
LAB_0010f225:
        iVar11 = dobeep_msg("Out of memory");
        return iVar11;
      }
      pmVar15->k_funcp[lVar13] = (PF)0x0;
      iVar11 = iVar11 + local_40;
      lVar13 = (long)ele->k_num - (long)ele->k_base;
      if (iVar11 <= (int)lVar13) {
        pp_Var4 = ele->k_funcp;
        lVar17 = 0;
        do {
          pp_Var7[(int)lVar17] = pp_Var4[iVar11 + lVar17];
          lVar1 = iVar11 + lVar17;
          lVar17 = lVar17 + 1;
        } while (lVar1 < lVar13);
      }
      sVar2 = curmap->map_num;
      for (pmVar15 = curmap->map_element + sVar2; ele < pmVar15; pmVar15 = pmVar15 + -1) {
        KVar6 = pmVar15[-1].k_num;
        pmVar15->k_base = pmVar15[-1].k_base;
        pmVar15->k_num = KVar6;
        pkVar8 = pmVar15[-1].k_prefmap;
        pmVar15->k_funcp = pmVar15[-1].k_funcp;
        pmVar15->k_prefmap = pkVar8;
      }
      ele->k_num = sVar18 - (short)uVar14;
      ele[1].k_base = (short)local_40 + sVar18;
      ele[1].k_funcp = pp_Var7;
      ele = ele + uVar14;
      ele->k_prefmap = (keymap_s *)0x0;
      curmap->map_num = sVar2 + 1;
      if (pref_map != (KEYMAP *)0x0) {
        ele->k_prefmap = pref_map;
        return 1;
      }
      pkVar8 = (keymap_s *)malloc(0x70);
      if (pkVar8 != (keymap_s *)0x0) {
        pkVar8->map_num = 0;
        pkVar8->map_max = 4;
        pkVar8->map_default = rescan;
        ele->k_prefmap = pkVar8;
        return 1;
      }
      dobeep_msg("Out of memory");
      p_Var9 = curmap->map_default;
      pp_Var7 = ele->k_funcp;
      lVar13 = (long)ele->k_base;
      goto LAB_0010f2ad;
    }
    bVar5 = true;
  }
  else {
    if (funct == (PF)0x0) {
      pkVar8 = ele->k_prefmap;
      goto LAB_0010f01f;
    }
    bVar5 = false;
  }
  if (pp_Var7[lVar13] == (PF)0x0) {
    ele->k_prefmap = (keymap_s *)0x0;
  }
  pp_Var7[lVar13] = funct;
  if (!bVar5) {
    return 1;
  }
  if (pref_map != (KEYMAP *)0x0) {
LAB_0010f08e:
    ele->k_prefmap = pref_map;
    return 1;
  }
  pkVar8 = (keymap_s *)malloc(0x70);
  if (pkVar8 != (keymap_s *)0x0) {
    pkVar8->map_num = 0;
    pkVar8->map_max = 4;
    pkVar8->map_default = rescan;
LAB_0010f0c1:
    ele->k_prefmap = pkVar8;
    return 1;
  }
  dobeep_msg("Out of memory");
  p_Var9 = curmap->map_default;
  pp_Var7 = ele->k_funcp;
  lVar13 = (long)ele->k_base;
LAB_0010f2ad:
  pp_Var7[c - lVar13] = p_Var9;
  return 0;
}

Assistant:

static int
remap(KEYMAP *curmap, int c, PF funct, KEYMAP *pref_map)
{
	int		 i, n1, n2, nold;
	KEYMAP		*mp, *newmap;
	PF		*pfp;
	struct map_element	*mep;

	if (ele >= &curmap->map_element[curmap->map_num] || c < ele->k_base) {
		if (ele > &curmap->map_element[0] && (funct != NULL ||
		    (ele - 1)->k_prefmap == NULL))
			n1 = c - (ele - 1)->k_num;
		else
			n1 = HUGE;
		if (ele < &curmap->map_element[curmap->map_num] &&
		    (funct != NULL || ele->k_prefmap == NULL))
			n2 = ele->k_base - c;
		else
			n2 = HUGE;
		if (n1 <= MAPELEDEF && n1 <= n2) {
			ele--;
			if ((pfp = calloc(c - ele->k_base + 1,
			    sizeof(PF))) == NULL)
				return (dobeep_msg("Out of memory"));

			nold = ele->k_num - ele->k_base + 1;
			for (i = 0; i < nold; i++)
				pfp[i] = ele->k_funcp[i];
			while (--n1)
				pfp[i++] = curmap->map_default;
			pfp[i] = funct;
			ele->k_num = c;
			ele->k_funcp = pfp;
		} else if (n2 <= MAPELEDEF) {
			if ((pfp = calloc(ele->k_num - c + 1,
			    sizeof(PF))) == NULL)
				return (dobeep_msg("Out of memory"));

			nold = ele->k_num - ele->k_base + 1;
			for (i = 0; i < nold; i++)
				pfp[i + n2] = ele->k_funcp[i];
			while (--n2)
				pfp[n2] = curmap->map_default;
			pfp[0] = funct;
			ele->k_base = c;
			ele->k_funcp = pfp;
		} else {
			if (curmap->map_num >= curmap->map_max) {
				if ((newmap = reallocmap(curmap)) == NULL)
					return (FALSE);
				curmap = newmap;
			}
			if ((pfp = malloc(sizeof(PF))) == NULL)
				return (dobeep_msg("Out of memory"));

			pfp[0] = funct;
			for (mep = &curmap->map_element[curmap->map_num];
			    mep > ele; mep--) {
				mep->k_base = (mep - 1)->k_base;
				mep->k_num = (mep - 1)->k_num;
				mep->k_funcp = (mep - 1)->k_funcp;
				mep->k_prefmap = (mep - 1)->k_prefmap;
			}
			ele->k_base = c;
			ele->k_num = c;
			ele->k_funcp = pfp;
			ele->k_prefmap = NULL;
			curmap->map_num++;
		}
		if (funct == NULL) {
			if (pref_map != NULL)
				ele->k_prefmap = pref_map;
			else {
				if ((mp = malloc(sizeof(KEYMAP) +
				    (MAPINIT - 1) * sizeof(struct map_element))) == NULL) {
					(void)dobeep_msg("Out of memory");
					ele->k_funcp[c - ele->k_base] =
					    curmap->map_default;
					return (FALSE);
				}
				mp->map_num = 0;
				mp->map_max = MAPINIT;
				mp->map_default = rescan;
				ele->k_prefmap = mp;
			}
		}
	} else {
		n1 = c - ele->k_base;
		if (ele->k_funcp[n1] == funct && (funct != NULL ||
		    pref_map == NULL || pref_map == ele->k_prefmap))
			/* no change */
			return (TRUE);
		if (funct != NULL || ele->k_prefmap == NULL) {
			if (ele->k_funcp[n1] == NULL)
				ele->k_prefmap = NULL;
			/* easy case */
			ele->k_funcp[n1] = funct;
			if (funct == NULL) {
				if (pref_map != NULL)
					ele->k_prefmap = pref_map;
				else {
					if ((mp = malloc(sizeof(KEYMAP) +
					    (MAPINIT - 1) *
					    sizeof(struct map_element))) == NULL) {
						(void)dobeep_msg("Out of memory");
						ele->k_funcp[c - ele->k_base] =
						    curmap->map_default;
						return (FALSE);
					}
					mp->map_num = 0;
					mp->map_max = MAPINIT;
					mp->map_default = rescan;
					ele->k_prefmap = mp;
				}
			}
		} else {
			/*
			 * This case is the splits.
			 * Determine which side of the break c goes on
			 * 0 = after break; 1 = before break
			 */
			n2 = 1;
			for (i = 0; n2 && i < n1; i++)
				n2 &= ele->k_funcp[i] != NULL;
			if (curmap->map_num >= curmap->map_max) {
				if ((newmap = reallocmap(curmap)) == NULL)
					return (FALSE);
				curmap = newmap;
			}
			if ((pfp = calloc(ele->k_num - c + !n2,
			    sizeof(PF))) == NULL)
				return (dobeep_msg("Out of memory"));

			ele->k_funcp[n1] = NULL;
			for (i = n1 + n2; i <= ele->k_num - ele->k_base; i++)
				pfp[i - n1 - n2] = ele->k_funcp[i];
			for (mep = &curmap->map_element[curmap->map_num];
			    mep > ele; mep--) {
				mep->k_base = (mep - 1)->k_base;
				mep->k_num = (mep - 1)->k_num;
				mep->k_funcp = (mep - 1)->k_funcp;
				mep->k_prefmap = (mep - 1)->k_prefmap;
			}
			ele->k_num = c - !n2;
			(ele + 1)->k_base = c + n2;
			(ele + 1)->k_funcp = pfp;
			ele += !n2;
			ele->k_prefmap = NULL;
			curmap->map_num++;
			if (pref_map == NULL) {
				if ((mp = malloc(sizeof(KEYMAP) + (MAPINIT - 1)
				    * sizeof(struct map_element))) == NULL) {
					(void)dobeep_msg("Out of memory");
					ele->k_funcp[c - ele->k_base] =
					    curmap->map_default;
					return (FALSE);
				}
				mp->map_num = 0;
				mp->map_max = MAPINIT;
				mp->map_default = rescan;
				ele->k_prefmap = mp;
			} else
				ele->k_prefmap = pref_map;
		}
	}
	return (TRUE);
}